

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino_template_generator.c
# Opt level: O0

_Bool pi_template_if_set(pi_template_generator_t *ptg_context)

{
  int local_1c;
  int i;
  pi_template_generator_t *ptg_context_local;
  
  local_1c = 0;
  while( true ) {
    if (ptg_context->if_stack_top <= local_1c) {
      return true;
    }
    if ((ptg_context->if_stack[local_1c] & 1U) == 0) break;
    local_1c = local_1c + 1;
  }
  return false;
}

Assistant:

bool pi_template_if_set(pi_template_generator_t *ptg_context) {
    for (int i = 0; i < ptg_context->if_stack_top; i++) {
        if (!ptg_context->if_stack[i]) {
            return false;
        }
    }
    return true;
}